

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O3

void get_esis_after_loss(int nESIs,uint32_t *ESIs,float loss)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  if (0 < nESIs) {
    uVar2 = 0xffffffff;
    uVar3 = 0;
    do {
      do {
        uVar2 = uVar2 + 1;
        iVar1 = rand();
      } while ((float)iVar1 * 4.656613e-10 < loss);
      ESIs[uVar3] = uVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nESIs);
  }
  return;
}

Assistant:

void get_esis_after_loss(int nESIs, uint32_t* ESIs, float loss)
{
	int esi = -1;
	for (int j = 0; j < nESIs; ++j) {
		do {
			++esi;
		} while (rand() / (RAND_MAX + 1.0) < loss);
		ESIs[j] = esi;
	}
}